

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall
tst_SerialiserCommon::saveLoadFile
          (tst_SerialiserCommon *this,AbstractModelSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  byte bVar1;
  int iVar2;
  int __oflag;
  QAbstractItemModel *__file;
  QModelIndex local_80;
  QModelIndex local_68;
  undefined4 local_50;
  QTemporaryFile local_40 [8];
  QTemporaryFile tempFile;
  bool checkHeaders_local;
  bool multiRole_local;
  QAbstractItemModel *destinationModel_local;
  QAbstractItemModel *sourceModel_local;
  AbstractModelSerialiser *serialiser_local;
  tst_SerialiserCommon *this_local;
  
  __file = sourceModel;
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if (multiRole) {
    __file = (QAbstractItemModel *)0x101;
    (**(code **)(*(long *)serialiser + 0x70))();
  }
  QTemporaryFile::QTemporaryFile(local_40);
  iVar2 = QTemporaryFile::open(local_40,(char *)__file,__oflag);
  bVar1 = QTest::qVerify((bool)((byte)iVar2 & 1),"tempFile.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x1b);
  if ((bVar1 & 1) == 0) {
    local_50 = 1;
  }
  else {
    bVar1 = (**(code **)(*(long *)serialiser + 0xa0))(serialiser,local_40);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->saveModel(&tempFile)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x1c);
    if ((bVar1 & 1) == 0) {
      local_50 = 1;
    }
    else {
      bVar1 = QFileDevice::seek((longlong)local_40);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"tempFile.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x1d);
      if ((bVar1 & 1) == 0) {
        local_50 = 1;
      }
      else {
        AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
        bVar1 = (**(code **)(*(long *)serialiser + 0xb0))(serialiser,local_40);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->loadModel(&tempFile)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x1f);
        if ((bVar1 & 1) == 0) {
          local_50 = 1;
        }
        else {
          QModelIndex::QModelIndex(&local_68);
          QModelIndex::QModelIndex(&local_80);
          checkModelEqual(this,sourceModel,destinationModel,&local_68,&local_80,checkHeaders);
          local_50 = 0;
        }
      }
    }
  }
  QTemporaryFile::~QTemporaryFile(local_40);
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadFile(AbstractModelSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                        QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile tempFile;
    QVERIFY(tempFile.open());
    QVERIFY(serialiser->saveModel(&tempFile));
    QVERIFY(tempFile.seek(0));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(&tempFile));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}